

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

ConstPixelBufferAccess *
tcu::flipYAccess(ConstPixelBufferAccess *__return_storage_ptr__,ConstPixelBufferAccess *access)

{
  int iVar1;
  IVec3 pitch;
  IVec3 local_14;
  
  iVar1 = (access->m_pitch).m_data[1];
  local_14.m_data[1] = -iVar1;
  local_14.m_data[0] = (access->m_pitch).m_data[0];
  local_14.m_data[2] = (access->m_pitch).m_data[2];
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,&access->m_format,&access->m_size,&local_14,
             (void *)((long)(((access->m_size).m_data[1] + -1) * iVar1) + (long)access->m_data));
  return __return_storage_ptr__;
}

Assistant:

ConstPixelBufferAccess flipYAccess (const ConstPixelBufferAccess& access)
{
	const int			rowPitch		= access.getRowPitch();
	const int			offsetToLast	= rowPitch*(access.getHeight()-1);
	const tcu::IVec3	pitch			(access.getPixelPitch(), -rowPitch, access.getSlicePitch());

	return ConstPixelBufferAccess(access.getFormat(), access.getSize(), pitch, (deUint8*)access.getDataPtr() + offsetToLast);
}